

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

void trad_enc_decrypt_update
               (trad_enc_ctx *ctx,uint8_t *in,size_t in_len,uint8_t *out,size_t out_len)

{
  byte bVar1;
  byte bVar2;
  size_t local_48;
  uint uStack_34;
  uint8_t t;
  uint max;
  uint i;
  size_t out_len_local;
  uint8_t *out_local;
  size_t in_len_local;
  uint8_t *in_local;
  trad_enc_ctx *ctx_local;
  
  local_48 = out_len;
  if (in_len < out_len) {
    local_48 = in_len;
  }
  for (uStack_34 = 0; uStack_34 < (uint)local_48; uStack_34 = uStack_34 + 1) {
    bVar1 = in[uStack_34];
    bVar2 = trad_enc_decypt_byte(ctx);
    out[uStack_34] = bVar1 ^ bVar2;
    trad_enc_update_keys(ctx,bVar1 ^ bVar2);
  }
  return;
}

Assistant:

static void
trad_enc_decrypt_update(struct trad_enc_ctx *ctx, const uint8_t *in,
    size_t in_len, uint8_t *out, size_t out_len)
{
	unsigned i, max;

	max = (unsigned)((in_len < out_len)? in_len: out_len);

	for (i = 0; i < max; i++) {
		uint8_t t = in[i] ^ trad_enc_decypt_byte(ctx);
		out[i] = t;
		trad_enc_update_keys(ctx, t);
	}
}